

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O1

void __thiscall glslang::HlslGrammar::acceptAttributes(HlslGrammar *this,TAttributes *attributes)

{
  HlslToken *pHVar1;
  size_t *psVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  TAttributeType TVar7;
  TPoolAllocator *this_00;
  TIntermAggregate *this_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _List_node_base *p_Var8;
  char *pcVar9;
  TIntermTyped *node;
  TString nameSpace;
  HlslToken local_98;
  _List_node_header *local_70;
  TIntermTyped *local_68;
  TIntermTyped *local_60;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_58;
  
  local_98.field_2.string =
       (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)0x0;
  local_98.loc.name = (TString *)0x0;
  local_98.loc.string = 0;
  local_98.loc.line = 0;
  local_98.loc.column = 0;
  bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftBracket);
  if (bVar3) {
    pHVar1 = &(this->super_HlslTokenStream).token;
    local_70 = &(attributes->
                super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                ).
                super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                ._M_impl._M_node;
    do {
      bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftBracket);
      bVar4 = acceptIdentifier(this,&local_98);
      if ((!bVar4) &&
         (bVar4 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokRightBracket),
         !bVar4)) {
        (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
          [0x2d])(this->parseContext,pHVar1,"Expected","namespace or attribute identifier","");
        HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
      }
      local_58._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
      bVar4 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokColonColon);
      if (bVar4) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        _M_assign(&local_58,local_98.field_2.string);
        bVar4 = acceptIdentifier(this,&local_98);
        if (!bVar4) {
          pcVar9 = "attribute identifier";
          goto LAB_003a29a2;
        }
      }
      bVar4 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
      if (bVar4) {
        this_00 = GetThreadPoolAllocator();
        this_01 = (TIntermAggregate *)TPoolAllocator::allocate(this_00,0x188);
        TIntermAggregate::TIntermAggregate(this_01);
        bVar4 = acceptAssignmentExpression(this,&local_60);
        if (bVar4) {
          do {
            iVar6 = (*(this_01->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[0x32])(this_01);
            local_68 = local_60;
            std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
            emplace_back<TIntermNode*>
                      ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
                       CONCAT44(extraout_var,iVar6),(TIntermNode **)&local_68);
            bVar4 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokComma);
            bVar5 = acceptAssignmentExpression(this,&local_60);
          } while (bVar5);
        }
        else {
          bVar4 = false;
        }
        bVar5 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightParen);
        if (!bVar5) {
          (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
            [0x2d])(this->parseContext,pHVar1,"Expected",")","");
        }
        if ((bVar4 != false) ||
           (iVar6 = (*(this_01->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[0x32])(this_01),
           *(long *)(CONCAT44(extraout_var_00,iVar6) + 8) ==
           *(long *)(CONCAT44(extraout_var_00,iVar6) + 0x10))) {
          (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
            [0x2d])(this->parseContext,pHVar1,"Expected","expression","");
        }
      }
      else {
        this_01 = (TIntermAggregate *)0x0;
      }
      bVar4 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightBracket);
      if (!bVar4) {
        pcVar9 = "]";
LAB_003a29a2:
        (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
          [0x2d])(this->parseContext,pHVar1,"Expected",pcVar9,"");
        return;
      }
      if ((bVar3) &&
         (bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightBracket),
         !bVar3)) {
        pcVar9 = "]]";
        goto LAB_003a29a2;
      }
      if (local_98.field_2.string != (TString *)0x0) {
        TVar7 = HlslParseContext::attributeFromName
                          (this->parseContext,&local_58,local_98.field_2.string);
        if (TVar7 == EatNone) {
          (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
            [0x2e])(this->parseContext,&local_98,"unrecognized attribute",
                    ((local_98.field_2.string)->_M_dataplus)._M_p,"");
        }
        else {
          p_Var8 = (_List_node_base *)
                   TPoolAllocator::allocate
                             ((attributes->
                              super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                              ).
                              super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                              ._M_impl.super__Node_alloc_type.allocator,0x20);
          *(TAttributeType *)&p_Var8[1]._M_next = TVar7;
          p_Var8[1]._M_prev = (_List_node_base *)this_01;
          std::__detail::_List_node_base::_M_hook(p_Var8);
          psVar2 = &(attributes->
                    super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                    ).
                    super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                    ._M_impl._M_node._M_size;
          *psVar2 = *psVar2 + 1;
        }
      }
      local_98.field_2.string =
           (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)0x0;
      local_98.loc.name = (TString *)0x0;
      local_98.loc.string = 0;
      local_98.loc.line = 0;
      local_98.loc.column = 0;
      bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftBracket);
    } while (bVar3);
  }
  return;
}

Assistant:

void HlslGrammar::acceptAttributes(TAttributes& attributes)
{
    // For now, accept the [ XXX(X) ] syntax, but drop all but
    // numthreads, which is used to set the CS local size.
    // TODO: subset to correct set?  Pass on?
    do {
        HlslToken attributeToken;

        // LEFT_BRACKET?
        if (! acceptTokenClass(EHTokLeftBracket))
            return;
        // another LEFT_BRACKET?
        bool doubleBrackets = false;
        if (acceptTokenClass(EHTokLeftBracket))
            doubleBrackets = true;

        // attribute? (could be namespace; will adjust later)
        if (!acceptIdentifier(attributeToken)) {
            if (!peekTokenClass(EHTokRightBracket)) {
                expected("namespace or attribute identifier");
                advanceToken();
            }
        }

        TString nameSpace;
        if (acceptTokenClass(EHTokColonColon)) {
            // namespace COLON COLON
            nameSpace = *attributeToken.string;
            // attribute
            if (!acceptIdentifier(attributeToken)) {
                expected("attribute identifier");
                return;
            }
        }

        TIntermAggregate* expressions = nullptr;

        // (x, ...)
        if (acceptTokenClass(EHTokLeftParen)) {
            expressions = new TIntermAggregate;

            TIntermTyped* node;
            bool expectingExpression = false;

            while (acceptAssignmentExpression(node)) {
                expectingExpression = false;
                expressions->getSequence().push_back(node);
                if (acceptTokenClass(EHTokComma))
                    expectingExpression = true;
            }

            // 'expressions' is an aggregate with the expressions in it
            if (! acceptTokenClass(EHTokRightParen))
                expected(")");

            // Error for partial or missing expression
            if (expectingExpression || expressions->getSequence().empty())
                expected("expression");
        }

        // RIGHT_BRACKET
        if (!acceptTokenClass(EHTokRightBracket)) {
            expected("]");
            return;
        }
        // another RIGHT_BRACKET?
        if (doubleBrackets && !acceptTokenClass(EHTokRightBracket)) {
            expected("]]");
            return;
        }

        // Add any values we found into the attribute map.
        if (attributeToken.string != nullptr) {
            TAttributeType attributeType = parseContext.attributeFromName(nameSpace, *attributeToken.string);
            if (attributeType == EatNone)
                parseContext.warn(attributeToken.loc, "unrecognized attribute", attributeToken.string->c_str(), "");
            else {
                TAttributeArgs attributeArgs = { attributeType, expressions };
                attributes.push_back(attributeArgs);
            }
        }
    } while (true);
}